

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix4d * tinyusdz::orthonormalize(matrix4d *__return_storage_ptr__,matrix4d *m,bool *result_valid)

{
  bool bVar1;
  double3 local_88;
  double3 local_68;
  double3 local_48;
  
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  local_48._M_elems[0] = m->m[0][0];
  local_48._M_elems[1] = m->m[0][1];
  local_48._M_elems[2] = m->m[0][2];
  local_68._M_elems[0] = m->m[1][0];
  local_68._M_elems[1] = m->m[1][1];
  local_68._M_elems[2] = m->m[1][2];
  local_88._M_elems[0] = m->m[2][0];
  local_88._M_elems[1] = m->m[2][1];
  local_88._M_elems[2] = m->m[2][2];
  bVar1 = orthonormalize_basis(&local_48,&local_68,&local_88,true,1e-06);
  __return_storage_ptr__->m[0][0] = local_48._M_elems[0];
  __return_storage_ptr__->m[0][1] = local_48._M_elems[1];
  __return_storage_ptr__->m[0][2] = local_48._M_elems[2];
  __return_storage_ptr__->m[1][0] = local_68._M_elems[0];
  __return_storage_ptr__->m[1][1] = local_68._M_elems[1];
  __return_storage_ptr__->m[1][2] = local_68._M_elems[2];
  __return_storage_ptr__->m[2][0] = local_88._M_elems[0];
  __return_storage_ptr__->m[2][1] = local_88._M_elems[1];
  __return_storage_ptr__->m[2][2] = local_88._M_elems[2];
  if (result_valid != (bool *)0x0) {
    *result_valid = bVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d orthonormalize(const value::matrix4d &m, bool *result_valid) {
  value::matrix4d ret = value::matrix4d::identity();

  // orthogonalize and normalize row vectors
  value::double3 r0{m.m[0][0], m.m[0][1], m.m[0][2]};
  value::double3 r1{m.m[1][0], m.m[1][1], m.m[1][2]};
  value::double3 r2{m.m[2][0], m.m[2][1], m.m[2][2]};
  bool result = orthonormalize_basis(r0, r1, r2, true);
  ret.m[0][0] = r0[0];
  ret.m[0][1] = r0[1];
  ret.m[0][2] = r0[2];
  ret.m[1][0] = r1[0];
  ret.m[1][1] = r1[1];
  ret.m[1][2] = r1[2];
  ret.m[2][0] = r2[0];
  ret.m[2][1] = r2[1];
  ret.m[2][2] = r2[2];

  // divide out any homogeneous coordinate - unless it's zero
  const double min_vector_length = 1e-10;  //
  if (!math::is_close(ret.m[3][3], 1.0,
                      std::numeric_limits<double>::epsilon()) &&
      !math::is_close(ret.m[3][3], 0.0, min_vector_length)) {
    ret.m[3][0] /= ret.m[3][3];
    ret.m[3][1] /= ret.m[3][3];
    ret.m[3][2] /= ret.m[3][3];
    ret.m[3][3] = 1.0;
  }

  if (result_valid) {
    (*result_valid) = result;
    // TF_WARN("OrthogonalizeBasis did not converge, matrix may not be "
    //               "orthonormal.");
  }

  return ret;
}